

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O1

ostream * Imath_2_5::operator<<(ostream *s,Vec3<float> *v)

{
  ostream *poVar1;
  char local_14;
  char local_13;
  char local_12;
  char local_11;
  
  std::__ostream_insert<char,std::char_traits<char>>(s,&local_14,1);
  poVar1 = std::ostream::_M_insert<double>((double)v->x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_13,1);
  poVar1 = std::ostream::_M_insert<double>((double)v->y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_12,1);
  poVar1 = std::ostream::_M_insert<double>((double)v->z);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_11,1);
  return poVar1;
}

Assistant:

std::ostream &
operator << (std::ostream &s, const Vec3<T> &v)
{
    return s << '(' << v.x << ' ' << v.y << ' ' << v.z << ')';
}